

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

void __thiscall
pybind11::cpp_function::initialize_generic
          (cpp_function *this,function_record *rec,char *text,type_info **types,size_t args)

{
  byte bVar1;
  pointer paVar2;
  type_info *tp;
  function_record *pfVar3;
  uint __val;
  PyMappingMethods *pPVar4;
  _Alloc_hider _Var5;
  uint uVar6;
  char cVar7;
  int iVar8;
  uint uVar9;
  char *pcVar10;
  type_info *ptVar11;
  function_record *pfVar12;
  PyMethodDef *pPVar13;
  object *poVar14;
  PyObject *pPVar15;
  long *plVar16;
  PyObject *pPVar17;
  ulong uVar18;
  PyTypeObject *pPVar19;
  function_record *pfVar20;
  ulong uVar21;
  size_type *psVar22;
  object *object;
  undefined4 uVar23;
  long lVar24;
  char cVar25;
  long lVar26;
  long lVar27;
  function_record *value;
  uint __len;
  uint uVar28;
  pointer paVar29;
  PyBufferProcs *pPVar30;
  bool bVar31;
  string signatures;
  capsule rec_capsule_1;
  object scope_module;
  string signature;
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  cpp_function *local_b0;
  long local_a8;
  function_record *local_a0;
  handle local_98;
  undefined1 local_90 [32];
  PyMappingMethods *local_70;
  enable_if_t<detail::move_if_unreferenced<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
  local_68;
  vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
  *local_48;
  PyBufferProcs *local_40;
  type_info **local_38;
  
  pcVar10 = "";
  if (rec->name != (char *)0x0) {
    pcVar10 = rec->name;
  }
  local_b0 = this;
  local_40 = (PyBufferProcs *)args;
  local_38 = types;
  pcVar10 = strdup(pcVar10);
  rec->name = pcVar10;
  if (rec->doc != (char *)0x0) {
    pcVar10 = strdup(rec->doc);
    rec->doc = pcVar10;
  }
  paVar29 = (rec->args).
            super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
            ._M_impl.super__Vector_impl_data._M_start;
  paVar2 = (rec->args).
           super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_a0 = rec;
  if (paVar29 != paVar2) {
    do {
      if (*(char **)paVar29 != (char *)0x0) {
        pcVar10 = strdup(*(char **)paVar29);
        *(char **)paVar29 = pcVar10;
      }
      if (*(char **)(paVar29 + 8) == (char *)0x0) {
        if (*(PyObject **)(paVar29 + 0x10) != (PyObject *)0x0) {
          local_e0._0_8_ = "__repr__";
          local_e0._8_8_ = 0;
          local_f0._8_8_ = *(PyObject **)(paVar29 + 0x10);
          detail::
          object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::
          operator()((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
                      *)&local_d0);
          cast<std::__cxx11::string>(&local_68,(pybind11 *)&local_d0,object);
          _Var5._M_p = local_68._M_dataplus._M_p;
          pcVar10 = strdup(local_68._M_dataplus._M_p);
          *(char **)(paVar29 + 8) = pcVar10;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var5._M_p != &local_68.field_2) {
            operator_delete(_Var5._M_p,
                            CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                                     local_68.field_2._M_local_buf[0]) + 1);
          }
          pybind11::object::~object((object *)&local_d0);
          pybind11::object::~object((object *)(local_e0 + 8));
        }
      }
      else {
        pcVar10 = strdup(*(char **)(paVar29 + 8));
        *(char **)(paVar29 + 8) = pcVar10;
      }
      paVar29 = paVar29 + 0x18;
    } while (paVar29 != paVar2);
  }
  local_48 = &local_a0->args;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_70 = (PyMappingMethods *)local_e0;
  pPVar30 = (PyBufferProcs *)0x0;
  local_a8 = 0;
  lVar26 = 0;
LAB_0010ef55:
  lVar24 = 0;
  lVar27 = lVar26;
LAB_0010ef5a:
  lVar26 = lVar27 + 1;
  bVar1 = text[lVar27];
  lVar27 = lVar26;
  if (0x7a < bVar1) {
    if (bVar1 != 0x7d) {
      if (bVar1 != 0x7b) goto LAB_0010ef84;
      if ((lVar24 == 0) && (text[lVar26] != '*' && pPVar30 < local_40)) {
        if ((local_a0->args).
            super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            (local_a0->args).
            super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          if ((local_a0->field_0x59 & 0x20) == 0 || pPVar30 != (PyBufferProcs *)0x0) {
            uVar21 = (long)pPVar30 - (ulong)(((byte)local_a0->field_0x59 >> 5 & 1) != 0);
            cVar25 = '\x01';
            if (9 < uVar21) {
              uVar18 = uVar21;
              cVar7 = '\x04';
              do {
                cVar25 = cVar7;
                if (uVar18 < 100) {
                  cVar25 = cVar25 + -2;
                  goto LAB_0010f123;
                }
                if (uVar18 < 1000) {
                  cVar25 = cVar25 + -1;
                  goto LAB_0010f123;
                }
                if (uVar18 < 10000) goto LAB_0010f123;
                bVar31 = 99999 < uVar18;
                uVar18 = uVar18 / 10000;
                cVar7 = cVar25 + '\x04';
              } while (bVar31);
              cVar25 = cVar25 + '\x01';
            }
LAB_0010f123:
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            std::__cxx11::string::_M_construct((ulong)&local_d0,cVar25);
            std::__detail::__to_chars_10_impl<unsigned_long>
                      (local_d0._M_dataplus._M_p,(uint)local_d0._M_string_length,uVar21);
            plVar16 = (long *)std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,0x118245)
            ;
            local_f0._0_8_ = local_e0;
            pPVar19 = (PyTypeObject *)(plVar16 + 2);
            if ((PyTypeObject *)*plVar16 == pPVar19) {
              local_e0._0_8_ = (pPVar19->ob_base).ob_base.ob_refcnt;
              local_e0._8_8_ = plVar16[3];
            }
            else {
              local_e0._0_8_ = (pPVar19->ob_base).ob_base.ob_refcnt;
              local_f0._0_8_ = (PyTypeObject *)*plVar16;
            }
            local_f0._8_8_ = plVar16[1];
            *plVar16 = (long)pPVar19;
            plVar16[1] = 0;
            *(undefined1 *)(plVar16 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_68,local_f0._0_8_);
            if ((PyTypeObject *)local_f0._0_8_ != (PyTypeObject *)local_e0) {
              operator_delete((void *)local_f0._0_8_,(ulong)(local_e0._0_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            std::__cxx11::string::append((char *)&local_68);
          }
        }
        else {
          std::__cxx11::string::append((char *)&local_68);
        }
        std::__cxx11::string::append((char *)&local_68);
      }
      lVar24 = lVar24 + 1;
      goto LAB_0010ef5a;
    }
    lVar24 = lVar24 + -1;
    if (lVar24 == 0) goto LAB_0010f20e;
    goto LAB_0010ef5a;
  }
  if (bVar1 != 0) {
    if (bVar1 == 0x25) {
      tp = local_38[local_a8];
      if (tp == (type_info *)0x0) {
        pybind11_fail("Internal error while parsing type signature (1)");
      }
      ptVar11 = detail::get_type_info(tp,false);
      local_a8 = local_a8 + 1;
      if (ptVar11 == (type_info *)0x0) {
        std::__cxx11::string::string
                  ((string *)local_f0,*(char **)(tp + 8) + (**(char **)(tp + 8) == '*'),
                   (allocator *)&local_d0);
        detail::clean_type_id((string *)local_f0);
        std::__cxx11::string::_M_append((char *)&local_68,local_f0._0_8_);
        if ((PyTypeObject *)local_f0._0_8_ != (PyTypeObject *)local_e0) {
          operator_delete((void *)local_f0._0_8_,(ulong)(local_e0._0_8_ + 1));
        }
      }
      else {
        std::__cxx11::string::append((char *)&local_68);
      }
    }
    else {
LAB_0010ef84:
      std::__cxx11::string::push_back((char)&local_68);
    }
    goto LAB_0010ef5a;
  }
  if ((lVar24 != 0) || (local_38[local_a8] != (type_info *)0x0)) {
    pybind11_fail("Internal error while parsing type signature (2)");
  }
  pcVar10 = strdup(local_68._M_dataplus._M_p);
  value = local_a0;
  local_a0->signature = pcVar10;
  if ((local_a0->args).
      super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage !=
      (local_a0->args).
      super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    __shrink_to_fit_aux<std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>,_true>
    ::_S_do_it(local_48);
  }
  pcVar10 = value->name;
  iVar8 = strcmp(pcVar10,"__init__");
  if (iVar8 == 0) {
    bVar31 = true;
  }
  else {
    iVar8 = strcmp(pcVar10,"__setstate__");
    bVar31 = iVar8 == 0;
  }
  value->field_0x59 = value->field_0x59 & 0xfe | bVar31;
  value->nargs = (uint16_t)local_40;
  pPVar15 = (value->sibling).m_ptr;
  if (pPVar15 != (PyObject *)0x0) {
    if (pPVar15->ob_type != (PyTypeObject *)&PyCFunction_Type) {
      iVar8 = PyType_IsSubtype(pPVar15->ob_type,&PyCFunction_Type);
      pPVar15 = (value->sibling).m_ptr;
      if (iVar8 == 0) {
        if ((pPVar15 != (PyObject *)&_Py_NoneStruct) && (*value->name != '_')) {
          std::__cxx11::string::string((string *)local_90,value->name,(allocator *)&local_98);
          std::operator+(&local_d0,"Cannot overload existing non-function object \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_90);
          plVar16 = (long *)std::__cxx11::string::append((char *)&local_d0);
          local_f0._0_8_ = *plVar16;
          psVar22 = (size_type *)(plVar16 + 2);
          if ((size_type *)local_f0._0_8_ == psVar22) {
            local_e0._0_8_ = *psVar22;
            local_e0._8_8_ = plVar16[3];
            local_f0._0_8_ = local_e0;
          }
          else {
            local_e0._0_8_ = *psVar22;
          }
          local_f0._8_8_ = plVar16[1];
          *plVar16 = (long)psVar22;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          pybind11_fail((string *)local_f0);
        }
        goto LAB_0010f440;
      }
    }
    if ((*(byte *)(pPVar15[1].ob_refcnt + 0x10) & 0x20) == 0) {
      local_f0._0_8_ = pPVar15[1].ob_type;
      if ((PyTypeObject *)local_f0._0_8_ != (PyTypeObject *)0x0) {
        (((PyTypeObject *)local_f0._0_8_)->ob_base).ob_base.ob_refcnt =
             (((PyTypeObject *)local_f0._0_8_)->ob_base).ob_base.ob_refcnt + 1;
      }
    }
    else {
      local_f0._0_8_ = (PyTypeObject *)0x0;
    }
    pfVar12 = capsule::operator_cast_to_function_record_((capsule *)local_f0);
    pPVar15 = (pfVar12->scope).m_ptr;
    pPVar17 = (value->scope).m_ptr;
    pybind11::object::~object((object *)local_f0);
    if (pPVar15 == pPVar17) {
      pPVar15 = (value->sibling).m_ptr;
      (local_b0->super_function).super_object.super_handle.m_ptr = pPVar15;
      pfVar3 = pfVar12;
      if (pPVar15 != (PyObject *)0x0) {
        pPVar15->ob_refcnt = pPVar15->ob_refcnt + 1;
      }
      do {
        pfVar20 = pfVar3;
        pfVar3 = pfVar20->next;
      } while (pfVar3 != (function_record *)0x0);
      pfVar20->next = value;
      local_f0._0_8_ = local_e0;
      local_f0._8_8_ = (PyObject *)0x0;
      local_e0._0_8_ = local_e0._0_8_ & 0xffffffffffffff00;
      if (DAT_0011e889 == '\x01') {
        std::__cxx11::string::append(local_f0);
        std::__cxx11::string::append(local_f0);
        std::__cxx11::string::append(local_f0);
      }
      if (pfVar12 != (function_record *)0x0) {
        uVar23 = 0;
LAB_0010f59e:
        uVar28 = 0;
        local_a8 = CONCAT44(local_a8._4_4_,uVar23);
        do {
          if (DAT_0011e889 == '\x01') {
            if ((char)uVar23 == '\0') {
              uVar28 = uVar28 + 1;
              __val = -uVar28;
              if (0 < (int)uVar28) {
                __val = uVar28;
              }
              __len = 1;
              if (9 < __val) {
                uVar21 = (ulong)__val;
                uVar6 = 4;
                do {
                  __len = uVar6;
                  uVar9 = (uint)uVar21;
                  if (uVar9 < 100) {
                    __len = __len - 2;
                    goto LAB_0010f622;
                  }
                  if (uVar9 < 1000) {
                    __len = __len - 1;
                    goto LAB_0010f622;
                  }
                  if (uVar9 < 10000) goto LAB_0010f622;
                  uVar21 = uVar21 / 10000;
                  uVar6 = __len + 4;
                } while (99999 < uVar9);
                __len = __len + 1;
              }
LAB_0010f622:
              local_90._0_8_ = local_90 + 0x10;
              std::__cxx11::string::_M_construct
                        ((ulong)local_90,(char)__len - (char)((int)uVar28 >> 0x1f));
              std::__detail::__to_chars_10_impl<unsigned_int>
                        ((char *)(local_90._0_8_ + (ulong)(uVar28 >> 0x1f)),__len,__val);
              plVar16 = (long *)std::__cxx11::string::append(local_90);
              value = local_a0;
              psVar22 = (size_type *)(plVar16 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar16 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar22) {
                local_d0.field_2._M_allocated_capacity = *psVar22;
                local_d0.field_2._8_8_ = plVar16[3];
                local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
              }
              else {
                local_d0.field_2._M_allocated_capacity = *psVar22;
                local_d0._M_dataplus._M_p = (pointer)*plVar16;
              }
              local_d0._M_string_length = plVar16[1];
              *plVar16 = (long)psVar22;
              plVar16[1] = 0;
              *(undefined1 *)(plVar16 + 2) = 0;
              std::__cxx11::string::_M_append(local_f0,(ulong)local_d0._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1
                               );
              }
              uVar23 = (undefined4)local_a8;
              if ((PyAsyncMethods *)local_90._0_8_ != (PyAsyncMethods *)(local_90 + 0x10)) {
                operator_delete((void *)local_90._0_8_,(ulong)(local_90._16_8_ + 1));
              }
            }
            std::__cxx11::string::append(local_f0);
            std::__cxx11::string::append(local_f0);
            std::__cxx11::string::append(local_f0);
          }
          if (((pfVar12->doc != (char *)0x0) && (*pfVar12->doc != '\0')) &&
             (options::global_state()::instance == '\x01')) {
            if (DAT_0011e889 == '\x01') {
              std::__cxx11::string::append(local_f0);
            }
            std::__cxx11::string::append(local_f0);
            if (DAT_0011e889 == '\x01') {
              std::__cxx11::string::append(local_f0);
            }
          }
          if (pfVar12->next == (function_record *)0x0) break;
          std::__cxx11::string::append(local_f0);
          pfVar12 = pfVar12->next;
        } while (pfVar12 != (function_record *)0x0);
      }
      pPVar15 = (local_b0->super_function).super_object.super_handle.m_ptr;
      lVar26 = pPVar15[1].ob_refcnt;
      if (*(void **)(lVar26 + 0x18) != (void *)0x0) {
        free(*(void **)(lVar26 + 0x18));
        lVar26 = pPVar15[1].ob_refcnt;
      }
      pcVar10 = strdup((char *)local_f0._0_8_);
      pPVar4 = local_70;
      *(char **)(lVar26 + 0x18) = pcVar10;
      if ((value->field_0x59 & 0x20) != 0) {
        pPVar17 = (PyObject *)
                  PyInstanceMethod_New((local_b0->super_function).super_object.super_handle.m_ptr);
        (local_b0->super_function).super_object.super_handle.m_ptr = pPVar17;
        if (pPVar17 == (PyObject *)0x0) {
          pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
        }
        pPVar15->ob_refcnt = pPVar15->ob_refcnt + -1;
        if (pPVar15->ob_refcnt == 0) {
          _Py_Dealloc(pPVar15);
        }
      }
      if ((PyMappingMethods *)local_f0._0_8_ != pPVar4) {
        operator_delete((void *)local_f0._0_8_,local_e0._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,
                        CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                                 local_68.field_2._M_local_buf[0]) + 1);
      }
      return;
    }
  }
LAB_0010f440:
  pPVar13 = (PyMethodDef *)operator_new(0x20);
  value->def = pPVar13;
  *(undefined8 *)&pPVar13->ml_flags = 0;
  pPVar13->ml_doc = (char *)0x0;
  pPVar13->ml_name = value->name;
  pPVar13->ml_meth = dispatcher;
  pPVar13->ml_flags = 3;
  capsule::capsule((capsule *)&local_d0,value,initialize_generic::anon_class_1_0_00000001::__invoke)
  ;
  local_90._0_8_ = (PyObject *)0x0;
  pPVar15 = (value->scope).m_ptr;
  if (pPVar15 != (PyObject *)0x0) {
    iVar8 = PyObject_HasAttrString(pPVar15,"__module__");
    if (iVar8 == 1) {
      local_f0._8_8_ = (value->scope).m_ptr;
      local_e0._0_8_ = "__module__";
      local_e0._8_8_ = 0;
      poVar14 = detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                          ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_f0);
    }
    else {
      iVar8 = PyObject_HasAttrString((value->scope).m_ptr,"__name__");
      if (iVar8 != 1) goto LAB_0010f541;
      local_f0._8_8_ = (value->scope).m_ptr;
      local_e0._0_8_ = "__name__";
      local_e0._8_8_ = 0;
      poVar14 = detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                          ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_f0);
    }
    local_98.m_ptr = (poVar14->super_handle).m_ptr;
    if (local_98.m_ptr != (PyObject *)0x0) {
      (local_98.m_ptr)->ob_refcnt = (local_98.m_ptr)->ob_refcnt + 1;
    }
    pybind11::object::operator=((object *)local_90,(object *)&local_98);
    pybind11::object::~object((object *)&local_98);
    pybind11::object::~object((object *)(local_e0 + 8));
  }
LAB_0010f541:
  pPVar15 = (PyObject *)PyCMethod_New(value->def,local_d0._M_dataplus._M_p,local_90._0_8_,0);
  (local_b0->super_function).super_object.super_handle.m_ptr = pPVar15;
  if (pPVar15 == (PyObject *)0x0) {
    pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
  }
  pybind11::object::~object((object *)local_90);
  pybind11::object::~object((object *)&local_d0);
  local_f0._0_8_ = local_e0;
  local_f0._8_8_ = (PyObject *)0x0;
  local_e0._0_8_ = local_e0._0_8_ & 0xffffffffffffff00;
  uVar23 = 1;
  pfVar12 = value;
  local_70 = (PyMappingMethods *)local_f0._0_8_;
  goto LAB_0010f59e;
LAB_0010f20e:
  paVar29 = (local_a0->args).
            super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((pPVar30 < (PyBufferProcs *)
                 (((long)(local_a0->args).
                         super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)paVar29 >> 3) *
                 -0x5555555555555555)) && (*(long *)(paVar29 + (long)pPVar30 * 0x18 + 8) != 0)) {
    std::__cxx11::string::append((char *)&local_68);
    std::__cxx11::string::append((char *)&local_68);
  }
  pPVar30 = (PyBufferProcs *)((long)&pPVar30->bf_getbuffer + 1);
  goto LAB_0010ef55;
}

Assistant:

void initialize_generic(detail::function_record *rec, const char *text,
                            const std::type_info *const *types, size_t args) {

        /* Create copies of all referenced C-style strings */
        rec->name = strdup(rec->name ? rec->name : "");
        if (rec->doc) rec->doc = strdup(rec->doc);
        for (auto &a: rec->args) {
            if (a.name)
                a.name = strdup(a.name);
            if (a.descr)
                a.descr = strdup(a.descr);
            else if (a.value)
                a.descr = strdup(a.value.attr("__repr__")().cast<std::string>().c_str());
        }

        /* Generate a proper function signature */
        std::string signature;
        size_t type_depth = 0, char_index = 0, type_index = 0, arg_index = 0;
        while (true) {
            char c = text[char_index++];
            if (c == '\0')
                break;

            if (c == '{') {
                // Write arg name for everything except *args, **kwargs and return type.
                if (type_depth == 0 && text[char_index] != '*' && arg_index < args) {
                    if (!rec->args.empty()) {
                        signature += rec->args[arg_index].name;
                    } else if (arg_index == 0 && rec->is_method) {
                        signature += "self";
                    } else {
                        signature += "arg" + std::to_string(arg_index - (rec->is_method ? 1 : 0));
                    }
                    signature += ": ";
                }
                ++type_depth;
            } else if (c == '}') {
                --type_depth;
                if (type_depth == 0) {
                    if (arg_index < rec->args.size() && rec->args[arg_index].descr) {
                        signature += "=";
                        signature += rec->args[arg_index].descr;
                    }
                    arg_index++;
                }
            } else if (c == '%') {
                const std::type_info *t = types[type_index++];
                if (!t)
                    pybind11_fail("Internal error while parsing type signature (1)");
                if (auto tinfo = detail::get_type_info(*t)) {
#if defined(PYPY_VERSION)
                    signature += handle((PyObject *) tinfo->type)
                                     .attr("__module__")
                                     .cast<std::string>() + ".";
#endif
                    signature += tinfo->type->tp_name;
                } else {
                    std::string tname(t->name());
                    detail::clean_type_id(tname);
                    signature += tname;
                }
            } else {
                signature += c;
            }
        }
        if (type_depth != 0 || types[type_index] != nullptr)
            pybind11_fail("Internal error while parsing type signature (2)");

        #if !defined(PYBIND11_CPP14)
            delete[] types;
            delete[] text;
        #endif

#if PY_MAJOR_VERSION < 3
        if (strcmp(rec->name, "__next__") == 0) {
            std::free(rec->name);
            rec->name = strdup("next");
        } else if (strcmp(rec->name, "__bool__") == 0) {
            std::free(rec->name);
            rec->name = strdup("__nonzero__");
        }
#endif
        rec->signature = strdup(signature.c_str());
        rec->args.shrink_to_fit();
        rec->is_constructor = !strcmp(rec->name, "__init__") || !strcmp(rec->name, "__setstate__");
        rec->nargs = (uint16_t) args;

#if PY_MAJOR_VERSION < 3
        if (rec->sibling && PyMethod_Check(rec->sibling.ptr()))
            rec->sibling = PyMethod_GET_FUNCTION(rec->sibling.ptr());
#endif

        detail::function_record *chain = nullptr, *chain_start = rec;
        if (rec->sibling) {
            if (PyCFunction_Check(rec->sibling.ptr())) {
                auto rec_capsule = reinterpret_borrow<capsule>(PyCFunction_GET_SELF(rec->sibling.ptr()));
                chain = (detail::function_record *) rec_capsule;
                /* Never append a method to an overload chain of a parent class;
                   instead, hide the parent's overloads in this case */
                if (chain->scope != rec->scope)
                    chain = nullptr;
            }
            // Don't trigger for things like the default __init__, which are wrapper_descriptors that we are intentionally replacing
            else if (!rec->sibling.is_none() && rec->name[0] != '_')
                pybind11_fail("Cannot overload existing non-function object \"" + std::string(rec->name) +
                        "\" with a function of the same name");
        }

        if (!chain) {
            /* No existing overload was found, create a new function object */
            rec->def = new PyMethodDef();
            memset(rec->def, 0, sizeof(PyMethodDef));
            rec->def->ml_name = rec->name;
            rec->def->ml_meth = reinterpret_cast<PyCFunction>(*dispatcher);
            rec->def->ml_flags = METH_VARARGS | METH_KEYWORDS;

            capsule rec_capsule(rec, [](PyObject *o) {
                destruct((detail::function_record *) PyCapsule_GetPointer(o, nullptr));
            });

            object scope_module;
            if (rec->scope) {
                if (hasattr(rec->scope, "__module__")) {
                    scope_module = rec->scope.attr("__module__");
                } else if (hasattr(rec->scope, "__name__")) {
                    scope_module = rec->scope.attr("__name__");
                }
            }

            m_ptr = PyCFunction_NewEx(rec->def, rec_capsule.ptr(), scope_module.ptr());
            if (!m_ptr)
                pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
        } else {
            /* Append at the end of the overload chain */
            m_ptr = rec->sibling.ptr();
            inc_ref();
            chain_start = chain;
            while (chain->next)
                chain = chain->next;
            chain->next = rec;
        }

        std::string signatures;
        int index = 0;
        /* Create a nice pydoc rec including all signatures and
           docstrings of the functions in the overload chain */
        if (chain && options::show_function_signatures()) {
            // First a generic signature
            signatures += rec->name;
            signatures += "(*args, **kwargs)\n";
            signatures += "Overloaded function.\n\n";
        }
        // Then specific overload signatures
        for (auto it = chain_start; it != nullptr; it = it->next) {
            if (options::show_function_signatures()) {
                if (chain)
                    signatures += std::to_string(++index) + ". ";
                signatures += rec->name;
                signatures += it->signature;
                signatures += "\n";
            }
            if (it->doc && strlen(it->doc) > 0 && options::show_user_defined_docstrings()) {
                if (options::show_function_signatures()) signatures += "\n";
                signatures += it->doc;
                if (options::show_function_signatures()) signatures += "\n";
            }
            if (it->next)
                signatures += "\n";
        }

        /* Install docstring */
        PyCFunctionObject *func = (PyCFunctionObject *) m_ptr;
        if (func->m_ml->ml_doc)
            std::free((char *) func->m_ml->ml_doc);
        func->m_ml->ml_doc = strdup(signatures.c_str());

        if (rec->is_method) {
            m_ptr = PYBIND11_INSTANCE_METHOD_NEW(m_ptr, rec->scope.ptr());
            if (!m_ptr)
                pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
            Py_DECREF(func);
        }
    }